

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::is_long_long(char *str)

{
  bool bVar1;
  QUtil *this;
  int in_ECX;
  exception *anon_var_0;
  string s1;
  longlong i1;
  char *str_local;
  
  this = (QUtil *)string_to_ll(str);
  int_to_string_abi_cxx11_((string *)&anon_var_0,this,0,in_ECX);
  bVar1 = std::operator==(str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &anon_var_0);
  std::__cxx11::string::~string((string *)&anon_var_0);
  return bVar1;
}

Assistant:

bool
QUtil::is_long_long(char const* str)
{
    try {
        auto i1 = string_to_ll(str);
        std::string s1 = int_to_string(i1);
        return str == s1;
    } catch (std::exception&) {
        // overflow or other error
    }
    return false;
}